

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_split_noMemoryAvailable_fn(int _i)

{
  int iVar1;
  ASplittedString *pAVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,";01;;23;",8);
  private_ACUtilsTest_AString_reallocFailCounter = 0;
  private_ACUtilsTest_AString_reallocFail = 1;
  pAVar2 = AString_split(&string,';',false);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa4f);
    if (string.buffer == (char *)0x0) {
      pAVar2 = (ASplittedString *)0x0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa4f);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pAVar2 = (ASplittedString *)0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar1 = strcmp(";01;;23;",string.buffer);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa4f);
          if (string.size != 8) {
            pcVar6 = "strlen(\";01;;23;\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).size == strlen(\";01;;23;\")";
            pcVar5 = "(string).size";
            pAVar2 = (ASplittedString *)string.size;
            goto LAB_001532c4;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa4f);
          if (pAVar2 != (ASplittedString *)0x0) {
            pcVar6 = (char *)0x0;
            expr = "Assertion \'_ck_x == NULL\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %#x";
            pcVar4 = "(void*) splitted == NULL";
            pcVar5 = "(void*) splitted";
            iVar1 = 0xa50;
            goto LAB_0015347c;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa50);
          if (private_ACUtilsTest_AString_reallocCount != private_ACUtilsTest_AString_freeCount) {
            pcVar6 = "(private_ACUtilsTest_AString_freeCount)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = 
            "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0xa51;
            pAVar2 = (ASplittedString *)private_ACUtilsTest_AString_reallocCount;
            goto LAB_0015347c;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa51);
          private_ACUtilsTest_AString_reallocFailCounter = 2;
          private_ACUtilsTest_AString_reallocFail = 1;
          pAVar2 = AString_split(&string,';',false);
          if (string.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa54);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0xa54);
              pcVar6 = string.buffer;
              if (string.buffer == (char *)0x0) {
                pcVar6 = "(null)";
                string.size = 0x16819b;
              }
              else {
                iVar1 = strcmp(";01;;23;",string.buffer);
                if (iVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa54);
                  if (string.size == 8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa54);
                    if (pAVar2 == (ASplittedString *)0x0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0xa55);
                      if (private_ACUtilsTest_AString_reallocCount ==
                          private_ACUtilsTest_AString_freeCount) {
                        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0xa56);
                        (*string.deallocator)(string.buffer);
                        return;
                      }
                      pcVar6 = "(private_ACUtilsTest_AString_freeCount)";
                      expr = "Assertion \'_ck_x == _ck_y\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                      pcVar4 = 
                      "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                      ;
                      pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                      iVar1 = 0xa56;
                      pAVar2 = (ASplittedString *)private_ACUtilsTest_AString_reallocCount;
                    }
                    else {
                      pcVar6 = (char *)0x0;
                      expr = "Assertion \'_ck_x == NULL\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar4 = "(void*) splitted == NULL";
                      pcVar5 = "(void*) splitted";
                      iVar1 = 0xa55;
                    }
                    goto LAB_0015347c;
                  }
                  pcVar6 = "strlen(\";01;;23;\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar4 = "(string).size == strlen(\";01;;23;\")";
                  pcVar5 = "(string).size";
                  goto LAB_00153477;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(string).buffer == (\";01;;23;\")";
              pcVar5 = "(string).buffer";
            }
          }
          else {
            pcVar6 = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).capacity == (8)";
            pcVar5 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_00153477:
          iVar1 = 0xa54;
          pAVar2 = (ASplittedString *)string.size;
          goto LAB_0015347c;
        }
        pAVar2 = (ASplittedString *)0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\";01;;23;\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (8)";
    pcVar5 = "(string).capacity";
    pAVar2 = (ASplittedString *)string.capacity;
  }
LAB_001532c4:
  iVar1 = 0xa4f;
LAB_0015347c:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar4,pcVar5,pAVar2,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_split_noMemoryAvailable)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString(";01;;23;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(true, 0);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NULL(splitted);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_setReallocFail(true, 2);
    splitted = AString_split(&string, ';', false);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NULL(splitted);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}